

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scan.h
# Opt level: O2

void __thiscall
charls::
jls_codec<charls::default_traits<unsigned_char,_charls::quad<unsigned_char>_>,_charls::encoder_strategy>
::encode_run_pixels(jls_codec<charls::default_traits<unsigned_char,_charls::quad<unsigned_char>_>,_charls::encoder_strategy>
                    *this,int32_t run_length,bool end_of_line)

{
  int iVar1;
  int iVar2;
  
  iVar2 = this->run_index_;
  while( true ) {
    if (run_length < 1 << ((byte)*(int *)(J + (long)iVar2 * 4) & 0x1f)) break;
    encoder_strategy::append_ones_to_bit_stream(&this->super_encoder_strategy,1);
    iVar1 = this->run_index_;
    run_length = run_length + (-1 << (J[(long)iVar1 * 4] & 0x1f));
    iVar2 = 0x1e;
    if (iVar1 < 0x1e) {
      iVar2 = iVar1;
    }
    iVar2 = iVar2 + 1;
    this->run_index_ = iVar2;
  }
  if (end_of_line) {
    if (run_length != 0) {
      encoder_strategy::append_ones_to_bit_stream(&this->super_encoder_strategy,1);
      return;
    }
    return;
  }
  encoder_strategy::append_to_bit_stream
            (&this->super_encoder_strategy,run_length,*(int *)(J + (long)iVar2 * 4) + 1);
  return;
}

Assistant:

void encode_run_pixels(int32_t run_length, const bool end_of_line)
    {
        while (run_length >= 1 << J[run_index_])
        {
            Strategy::append_ones_to_bit_stream(1);
            run_length = run_length - (1 << J[run_index_]);
            increment_run_index();
        }

        if (end_of_line)
        {
            if (run_length != 0)
            {
                Strategy::append_ones_to_bit_stream(1);
            }
        }
        else
        {
            Strategy::append_to_bit_stream(run_length, J[run_index_] + 1); // leading 0 + actual remaining length
        }
    }